

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

double __thiscall chrono::ChSolverADMM::_SolveBasic(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  _func_int **pp_Var5;
  ChSparseMatrix *pCVar6;
  size_t sVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ChConstraint *pCVar14;
  element_type *peVar15;
  double *pdVar16;
  ChVectorDynamic<> *pCVar17;
  double *pdVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  SparseMatrix<double,_1,_int> *pSVar26;
  SparseMatrix<double,_1,_int> *pSVar27;
  Index IVar28;
  Index IVar29;
  SparseMatrix<double,_1,_int> *pSVar30;
  ChVectorDynamic<> *pCVar31;
  StorageIndex *pSVar32;
  StorageIndex *pSVar33;
  StorageIndex *pSVar34;
  Scalar *pSVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  _func_int *p_Var40;
  _func_int *p_Var41;
  _func_int *p_Var42;
  _func_int *p_Var43;
  _func_int *p_Var44;
  _func_int *p_Var45;
  _func_int *p_Var46;
  _func_int **pp_Var47;
  undefined8 uVar48;
  uint uVar49;
  uint nrows;
  AdmmStepType AVar50;
  Scalar *pSVar51;
  ChLog *pCVar52;
  ChStreamOutAscii *pCVar53;
  uint uVar54;
  Index index;
  ulong uVar55;
  ulong uVar56;
  Index IVar57;
  char *pcVar58;
  Index index_3;
  long lVar59;
  pointer ppCVar60;
  Index IVar61;
  int iVar62;
  uint uVar63;
  ChVectorDynamic<> *pCVar64;
  ulong uVar65;
  ulong uVar66;
  Index index_11;
  int iVar67;
  Index size;
  ActualDstType actualDst;
  ulong rows;
  long lVar68;
  pointer ppCVar69;
  Index size_1;
  pointer ppCVar70;
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  Scalar SVar75;
  Scalar SVar77;
  undefined1 auVar78 [16];
  Scalar SVar76;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar87 [64];
  undefined1 auVar84 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  double dVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  double local_440;
  ChVectorDynamic<> z;
  ChVectorDynamic<> l;
  assign_op<double,_double> local_409;
  ChVectorDynamic<> vrho;
  ChVectorDynamic<> S;
  Index innerSize_1;
  double local_3d8;
  double local_3d0;
  ChVectorDynamic<> y;
  Index innerSize;
  ChVectorDynamic<> z_old;
  SrcEvaluatorType srcEvaluator;
  ChVectorDynamic<> IS;
  ChVectorDynamic<> l_old;
  ChVectorDynamic<> v;
  SparseMatrix<double,_1,_int> *local_330;
  Scalar *local_328;
  StorageIndex *local_320;
  ChVectorDynamic<> *local_318;
  undefined1 local_310 [8];
  variable_if_dynamic<long,__1> local_308;
  variable_if_dynamic<long,__1> local_300;
  SparseMatrix<double,_1,_int> *pSStack_2f8;
  variable_if_dynamic<long,__1> vStack_2f0;
  variable_if_dynamic<long,__1> vStack_2e8;
  CompressedStorage<double,_int> CStack_2e0;
  ChVectorDynamic<> b;
  ChVectorDynamic<> B;
  Scalar local_288;
  ChVectorDynamic<> vsigma;
  ChVectorDynamic<> y_old;
  undefined1 local_248 [16];
  assign_op<double,_double> *local_238;
  DstXprType *local_230;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_228;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_220;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_218;
  evaluator<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_210;
  ChVectorDynamic<> k;
  double local_1f8;
  SparseMatrix<double,_1,_int> local_1e8;
  Index alignedEnd_1;
  Index alignedEnd;
  long local_188;
  long local_180;
  ChSparseMatrix Cq;
  DstEvaluatorType dstEvaluator;
  ChSparsityPatternLearner sparsity_pattern;
  ChSparseMatrix E;
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  
  local_1f8 = this->rho;
  uVar49 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  uVar65 = (ulong)uVar49;
  nrows = (*sysd->_vptr_ChSystemDescriptor[7])(sysd);
  pCVar64 = (ChVectorDynamic<> *)(long)(int)nrows;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)pCVar64);
  if (uVar49 == 0) {
    local_308.m_value = local_308.m_value & 0xffffffffffffff00;
    local_310 = (undefined1  [8])&PTR_SetElement_00b0c488;
    local_300.m_value = 0;
    pSStack_2f8 = (SparseMatrix<double,_1,_int> *)0x0;
    vStack_2f0.m_value = 0;
    vStack_2e8.m_value = 0;
    CStack_2e0.m_values = (Scalar *)0x0;
    CStack_2e0.m_indices = (StorageIndex *)0x0;
    CStack_2e0.m_size = 0;
    CStack_2e0.m_allocatedSize = 0;
    Eigen::SparseMatrix<double,_1,_int>::resize
              ((SparseMatrix<double,_1,_int> *)local_310,(Index)pCVar64,(Index)pCVar64);
    Cq._vptr_SparseMatrix = (_func_int **)0x0;
    Cq.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)0x0;
    Cq._9_7_ = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Cq,(Index)pCVar64);
    lVar68 = std::chrono::_V2::system_clock::now();
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,nrows,nrows);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,(ChSparseMatrix *)local_310);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,local_310,&Cq);
    peVar15 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_308.m_value._0_1_ == true) {
      pSVar26 = (SparseMatrix<double,_1,_int> *)(peVar15->m_mat).m_outerSize;
      pSVar27 = (SparseMatrix<double,_1,_int> *)(peVar15->m_mat).m_innerSize;
      (peVar15->m_mat).m_outerSize = local_300.m_value;
      (peVar15->m_mat).m_innerSize = (Index)pSStack_2f8;
      pSVar30 = (SparseMatrix<double,_1,_int> *)(peVar15->m_mat).m_outerIndex;
      pCVar17 = (ChVectorDynamic<> *)(peVar15->m_mat).m_innerNonZeros;
      pCVar31 = (ChVectorDynamic<> *)(peVar15->m_mat).m_data.m_values;
      pSVar32 = (peVar15->m_mat).m_data.m_indices;
      (peVar15->m_mat).m_outerIndex = (StorageIndex *)vStack_2f0.m_value;
      (peVar15->m_mat).m_innerNonZeros = (StorageIndex *)vStack_2e8.m_value;
      (peVar15->m_mat).m_data.m_values = CStack_2e0.m_values;
      (peVar15->m_mat).m_data.m_indices = CStack_2e0.m_indices;
      pCVar64 = (ChVectorDynamic<> *)(peVar15->m_mat).m_data.m_size;
      IVar61 = (peVar15->m_mat).m_data.m_allocatedSize;
      (peVar15->m_mat).m_data.m_size = CStack_2e0.m_size;
      (peVar15->m_mat).m_data.m_allocatedSize = CStack_2e0.m_allocatedSize;
      local_300.m_value = (long)pSVar26;
      pSStack_2f8 = pSVar27;
      vStack_2f0.m_value = (long)pSVar30;
      vStack_2e8.m_value = (long)pCVar17;
      CStack_2e0.m_values = (Scalar *)pCVar31;
      CStack_2e0.m_indices = pSVar32;
      CStack_2e0.m_size = (Index)pCVar64;
      CStack_2e0.m_allocatedSize = IVar61;
    }
    else {
      pCVar6 = &peVar15->m_mat;
      if (pCVar6 != (ChSparseMatrix *)local_310) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,(SparseMatrix<double,_1,_int> *)local_310);
        if ((ChVectorDynamic<> *)vStack_2e8.m_value == (ChVectorDynamic<> *)0x0) {
          sVar7 = (peVar15->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar15->m_mat).m_outerIndex,(void *)vStack_2f0.m_value,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar15->m_mat).m_data,&CStack_2e0);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,(SparseMatrix<double,_1,_int> *)local_310);
        }
      }
    }
    uVar48 = Cq._8_8_;
    pp_Var47 = Cq._vptr_SparseMatrix;
    peVar15 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != Cq._8_8_) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   Cq._8_8_,1),
       (peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows != uVar48)) goto LAB_007c3933;
    pdVar18 = (peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar65 = uVar48 + 7;
    if (-1 < (long)uVar48) {
      uVar65 = uVar48;
    }
    uVar65 = uVar65 & 0xfffffffffffffff8;
    if (7 < (long)uVar48) {
      lVar59 = 0;
      do {
        pp_Var5 = pp_Var47 + lVar59;
        p_Var40 = pp_Var5[1];
        p_Var41 = pp_Var5[2];
        p_Var42 = pp_Var5[3];
        p_Var43 = pp_Var5[4];
        p_Var44 = pp_Var5[5];
        p_Var45 = pp_Var5[6];
        p_Var46 = pp_Var5[7];
        pdVar16 = pdVar18 + lVar59;
        *pdVar16 = (double)*pp_Var5;
        pdVar16[1] = (double)p_Var40;
        pdVar16[2] = (double)p_Var41;
        pdVar16[3] = (double)p_Var42;
        pdVar16[4] = (double)p_Var43;
        pdVar16[5] = (double)p_Var44;
        pdVar16[6] = (double)p_Var45;
        pdVar16[7] = (double)p_Var46;
        lVar59 = lVar59 + 8;
      } while (lVar59 < (long)uVar65);
    }
    if ((long)uVar65 < (long)uVar48) {
      do {
        pdVar18[uVar65] = (double)pp_Var47[uVar65];
        uVar65 = uVar65 + 1;
      } while (uVar48 != uVar65);
    }
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar52 = GetLog();
      pCVar53 = ChStreamOutAscii::operator<<
                          (&pCVar52->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      lVar59 = std::chrono::_V2::system_clock::now();
      pCVar53 = ChStreamOutAscii::operator<<(pCVar53,(double)(lVar59 - lVar68) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar53,"s\n");
    }
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
    (*sysd->_vptr_ChSystemDescriptor[0x11])
              (sysd,&((this->LS_solver).
                      super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_sol);
    ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
    if (Cq._vptr_SparseMatrix != (_func_int **)0x0) {
      free(Cq._vptr_SparseMatrix[-1]);
    }
    local_310 = (undefined1  [8])&PTR_SetElement_00b0c488;
    free((void *)vStack_2f0.m_value);
    free((void *)vStack_2e8.m_value);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&CStack_2e0);
    local_440 = 0.0;
    goto LAB_007c3729;
  }
  rows = (ulong)(int)uVar49;
  Cq._8_8_ = Cq._8_8_ & 0xffffffffffffff00;
  Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  Cq.m_outerSize = 0;
  Cq.m_innerSize = 0;
  Cq.m_outerIndex = (StorageIndex *)0x0;
  Cq.m_innerNonZeros = (StorageIndex *)0x0;
  Cq.m_data.m_values = (Scalar *)0x0;
  Cq.m_data.m_indices = (StorageIndex *)0x0;
  Cq.m_data.m_size = 0;
  Cq.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&Cq,rows,(Index)pCVar64);
  E.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  E.m_outerSize = 0;
  E.m_innerSize = 0;
  E.m_outerIndex = (StorageIndex *)0x0;
  E.m_innerNonZeros = (StorageIndex *)0x0;
  E.m_data.m_values = (Scalar *)0x0;
  E.m_data.m_indices = (StorageIndex *)0x0;
  E.m_data.m_size = 0;
  E.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&E,rows,rows);
  k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(Index)pCVar64);
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  local_1e8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  iVar67 = nrows + uVar49;
  lVar68 = (long)iVar67;
  local_1e8._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
  local_1e8.m_outerSize = 0;
  local_1e8.m_innerSize = 0;
  local_1e8.m_outerIndex = (StorageIndex *)0x0;
  local_1e8.m_innerNonZeros = (StorageIndex *)0x0;
  local_1e8.m_data.m_values = (Scalar *)0x0;
  local_1e8.m_data.m_indices = (StorageIndex *)0x0;
  local_1e8.m_data.m_size = 0;
  local_1e8.m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_1,_int>::resize(&local_1e8,lVar68,lVar68);
  B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,lVar68);
  l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  (*sysd->_vptr_ChSystemDescriptor[0x1b])(sysd,&Cq,0);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&Cq);
  Eigen::SparseMatrix<double,_1,_int>::makeCompressed(&E);
  if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
  }
  else {
    (*sysd->_vptr_ChSystemDescriptor[0x12])(sysd,&l,0);
    (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,&v,0);
    if ((Cq.m_innerSize !=
         v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) ||
       (E.m_innerSize !=
        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
      pcVar58 = 
      "Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::SparseMatrix<double, 1>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      goto LAB_007c38f7;
    }
    if (Cq.m_outerSize != E.m_outerSize) {
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>]"
      ;
      goto LAB_007c39e0;
    }
    if (Cq.m_outerSize !=
        b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>, const Eigen::Product<Eigen::SparseMatrix<double, 1>, Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007c39e0;
    }
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize = (Index)&Cq;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerSize = (Index)&v;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerIndex = (StorageIndex *)&E;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_innerNonZeros = (StorageIndex *)&l;
    sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_data.m_indices = (StorageIndex *)&b;
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>,Eigen::internal::assign_op<double,double>>
              (&y,(CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)&sparsity_pattern,(assign_op<double,_double> *)local_310);
    IVar61 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar18 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if ((z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   ,1),
       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != IVar61))
    goto LAB_007c3933;
    uVar55 = IVar61 + 7;
    if (-1 < IVar61) {
      uVar55 = IVar61;
    }
    uVar55 = uVar55 & 0xfffffffffffffff8;
    if (7 < IVar61) {
      lVar59 = 0;
      do {
        pdVar16 = pdVar18 + lVar59;
        dVar91 = pdVar16[1];
        dVar8 = pdVar16[2];
        dVar9 = pdVar16[3];
        dVar36 = pdVar16[4];
        dVar37 = pdVar16[5];
        dVar38 = pdVar16[6];
        dVar39 = pdVar16[7];
        pdVar1 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 lVar59;
        *pdVar1 = *pdVar16;
        pdVar1[1] = dVar91;
        pdVar1[2] = dVar8;
        pdVar1[3] = dVar9;
        pdVar1[4] = dVar36;
        pdVar1[5] = dVar37;
        pdVar1[6] = dVar38;
        pdVar1[7] = dVar39;
        lVar59 = lVar59 + 8;
      } while (lVar59 < (long)uVar55);
    }
    if ((long)uVar55 < IVar61) {
      do {
        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar55] =
             pdVar18[uVar55];
        uVar55 = uVar55 + 1;
      } while (IVar61 != uVar55);
    }
  }
  S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = (double *)0x0;
  S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
  if (this->precond == true) {
    ppCVar69 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar70 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar70 == ppCVar69) {
      uVar55 = 0;
    }
    else {
      uVar56 = 0;
      uVar66 = 1;
      do {
        (*ppCVar69[uVar56]->_vptr_ChConstraint[6])();
        ppCVar69 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar70 = (sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        uVar55 = (long)ppCVar70 - (long)ppCVar69 >> 3;
        bVar19 = uVar66 < uVar55;
        uVar56 = uVar66;
        uVar66 = (ulong)((int)uVar66 + 1);
      } while (bVar19);
    }
    if (uVar55 != 0) {
      uVar54 = 1;
      iVar62 = 0;
      ppCVar60 = ppCVar69;
      do {
        pCVar14 = *ppCVar60;
        if (pCVar14->mode == CONSTRAINT_FRIC) {
          (&sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix)[iVar62] =
               (_func_int **)pCVar14->g_i;
          iVar62 = iVar62 + 1;
          if (iVar62 == 3) {
            dVar91 = ((double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._vptr_SparseMatrix
                      + (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>._8_8_ +
                     (double)sparsity_pattern.super_SparseMatrix<double,_1,_int>.m_outerSize) / 3.0;
            ppCVar69[uVar54 - 3]->g_i = dVar91;
            ppCVar69[uVar54 - 2]->g_i = dVar91;
            iVar62 = 0;
            pCVar14->g_i = dVar91;
          }
        }
        uVar56 = (ulong)uVar54;
        ppCVar60 = ppCVar60 + 1;
        uVar54 = uVar54 + 1;
      } while (uVar56 < uVar55);
    }
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      memset(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data,0,
             S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows << 3)
      ;
    }
    if (ppCVar70 != ppCVar69) {
      iVar62 = 0;
      uVar55 = 0;
      uVar56 = 1;
      do {
        if (ppCVar69[uVar55]->active == true) {
          dVar91 = ppCVar69[uVar55]->g_i;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = dVar91;
          if (dVar91 < 0.0) {
            dVar91 = sqrt(dVar91);
          }
          else {
            auVar80 = vsqrtsd_avx(auVar80,auVar80);
            dVar91 = auVar80._0_8_;
          }
          if ((iVar62 < 0) ||
             (lVar59 = (long)iVar62,
             S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
             lVar59)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          iVar62 = iVar62 + 1;
          S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar59]
               = dVar91;
          ppCVar69 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar70 = (sysd->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar19 = uVar56 < (ulong)((long)ppCVar70 - (long)ppCVar69 >> 3);
        uVar55 = uVar56;
        uVar56 = (ulong)((int)uVar56 + 1);
      } while (bVar19);
    }
    if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar55 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar55 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar59 = 0;
        do {
          auVar71 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (b.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar59),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar59));
          *(undefined1 (*) [64])
           (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar59) = auVar71;
          lVar59 = lVar59 + 8;
        } while (lVar59 < (long)uVar55);
      }
      uVar56 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((long)uVar55 <
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar55]
               = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar55] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar55];
          uVar55 = uVar55 + 1;
          uVar56 = S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        } while (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar55);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          uVar56) {
        uVar55 = uVar56 + 7;
        if (-1 < (long)uVar56) {
          uVar55 = uVar56;
        }
        uVar55 = uVar55 & 0xfffffffffffffff8;
        if (7 < (long)uVar56) {
          lVar59 = 0;
          do {
            auVar71 = vdivpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar59),
                                     *(undefined1 (*) [64])
                                      (S.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar59));
            *(undefined1 (*) [64])
             (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar59) = auVar71;
            lVar59 = lVar59 + 8;
          } while (lVar59 < (long)uVar55);
        }
        uVar66 = uVar55;
        if ((long)uVar55 < (long)uVar56) {
          do {
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar66] = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar66] /
                       S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar66];
            uVar66 = uVar66 + 1;
          } while (uVar56 != uVar66);
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            uVar56) {
          if (7 < (long)uVar56) {
            lVar59 = 0;
            do {
              auVar71 = vdivpd_avx512f(*(undefined1 (*) [64])
                                        (z.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar59),
                                       *(undefined1 (*) [64])
                                        (S.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data + lVar59));
              *(undefined1 (*) [64])
               (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               lVar59) = auVar71;
              lVar59 = lVar59 + 8;
            } while (lVar59 < (long)uVar55);
          }
          if ((long)uVar55 < (long)uVar56) {
            do {
              z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [uVar55] = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar55] /
                         S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_data[uVar55];
              uVar55 = uVar55 + 1;
            } while (uVar56 != uVar55);
          }
          if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
            uVar55 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows + 7;
            if (-1 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows) {
              uVar55 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows;
            }
            uVar55 = uVar55 & 0xfffffffffffffff8;
            if (7 < y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
              lVar59 = 0;
              do {
                auVar71 = vmulpd_avx512f(*(undefined1 (*) [64])
                                          (y.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar59),
                                         *(undefined1 (*) [64])
                                          (S.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           .m_storage.m_data + lVar59));
                *(undefined1 (*) [64])
                 (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 + lVar59) = auVar71;
                lVar59 = lVar59 + 8;
              } while (lVar59 < (long)uVar55);
            }
            if ((long)uVar55 <
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
              do {
                y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                [uVar55] = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar55] *
                           S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar55];
                uVar55 = uVar55 + 1;
              } while (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows != uVar55);
            }
            goto LAB_007c18ac;
          }
          goto LAB_007c3b77;
        }
      }
LAB_007c388c:
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007c39e0;
    }
  }
  else {
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      auVar71 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar72 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar73 = vpbroadcastq_avx512f();
      lVar59 = 0;
      do {
        auVar74 = vpbroadcastq_avx512f();
        auVar74 = vporq_avx512f(auVar74,auVar72);
        uVar55 = vpcmpuq_avx512f(auVar74,auVar73,2);
        pdVar18 = S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                  + lVar59;
        bVar19 = (bool)((byte)uVar55 & 1);
        bVar20 = (bool)((byte)(uVar55 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar55 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar55 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar55 >> 4) & 1);
        bVar24 = (bool)((byte)(uVar55 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar55 >> 6) & 1);
        *pdVar18 = (double)((ulong)bVar19 * auVar71._0_8_ | (ulong)!bVar19 * (long)*pdVar18);
        pdVar18[1] = (double)((ulong)bVar20 * auVar71._8_8_ | (ulong)!bVar20 * (long)pdVar18[1]);
        pdVar18[2] = (double)((ulong)bVar21 * auVar71._16_8_ | (ulong)!bVar21 * (long)pdVar18[2]);
        pdVar18[3] = (double)((ulong)bVar22 * auVar71._24_8_ | (ulong)!bVar22 * (long)pdVar18[3]);
        pdVar18[4] = (double)((ulong)bVar23 * auVar71._32_8_ | (ulong)!bVar23 * (long)pdVar18[4]);
        pdVar18[5] = (double)((ulong)bVar24 * auVar71._40_8_ | (ulong)!bVar24 * (long)pdVar18[5]);
        pdVar18[6] = (double)((ulong)bVar25 * auVar71._48_8_ | (ulong)!bVar25 * (long)pdVar18[6]);
        pdVar18[7] = (double)((uVar55 >> 7) * auVar71._56_8_ |
                             (ulong)!SUB81(uVar55 >> 7,0) * (long)pdVar18[7]);
        lVar59 = lVar59 + 8;
      } while (((S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
LAB_007c18ac:
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    {
LAB_007c3b58:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
    {
      auVar72 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar73 = vpbroadcastq_avx512f();
      lVar59 = 0;
      auVar71._0_8_ = this->sigma;
      auVar71._8_4_ = this->stepadjust_each;
      auVar71._12_4_ = *(undefined4 *)&this->field_0xec;
      auVar71._16_8_ = this->stepadjust_threshold;
      auVar71._24_8_ = this->stepadjust_maxfactor;
      auVar71._32_4_ = this->stepadjust_type;
      auVar71._36_4_ = *(undefined4 *)&this->field_0x104;
      auVar71._40_8_ = this->tol_prim;
      auVar71._48_8_ = this->tol_dual;
      auVar71._56_4_ = this->acceleration;
      auVar71._60_4_ = *(undefined4 *)&this->field_0x11c;
      auVar71 = vbroadcastsd_avx512f(auVar71._0_16_);
      do {
        auVar74 = vpbroadcastq_avx512f();
        auVar74 = vporq_avx512f(auVar74,auVar72);
        uVar55 = vpcmpuq_avx512f(auVar74,auVar73,2);
        pdVar18 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + lVar59;
        bVar19 = (bool)((byte)uVar55 & 1);
        bVar20 = (bool)((byte)(uVar55 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar55 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar55 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar55 >> 4) & 1);
        bVar24 = (bool)((byte)(uVar55 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar55 >> 6) & 1);
        *pdVar18 = (double)((ulong)bVar19 * auVar71._0_8_ | (ulong)!bVar19 * (long)*pdVar18);
        pdVar18[1] = (double)((ulong)bVar20 * auVar71._8_8_ | (ulong)!bVar20 * (long)pdVar18[1]);
        pdVar18[2] = (double)((ulong)bVar21 * auVar71._16_8_ | (ulong)!bVar21 * (long)pdVar18[2]);
        pdVar18[3] = (double)((ulong)bVar22 * auVar71._24_8_ | (ulong)!bVar22 * (long)pdVar18[3]);
        pdVar18[4] = (double)((ulong)bVar23 * auVar71._32_8_ | (ulong)!bVar23 * (long)pdVar18[4]);
        pdVar18[5] = (double)((ulong)bVar24 * auVar71._40_8_ | (ulong)!bVar24 * (long)pdVar18[5]);
        pdVar18[6] = (double)((ulong)bVar25 * auVar71._48_8_ | (ulong)!bVar25 * (long)pdVar18[6]);
        pdVar18[7] = (double)((uVar55 >> 7) * auVar71._56_8_ |
                             (ulong)!SUB81(uVar55 >> 7,0) * (long)pdVar18[7]);
        lVar59 = lVar59 + 8;
      } while (((vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows);
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0)
    goto LAB_007c3b58;
    if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_1f8;
      auVar71 = vbroadcastsd_avx512f(auVar12);
      auVar72 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar73 = vpbroadcastq_avx512f();
      lVar59 = 0;
      do {
        auVar74 = vpbroadcastq_avx512f();
        auVar74 = vporq_avx512f(auVar74,auVar72);
        uVar55 = vpcmpuq_avx512f(auVar74,auVar73,2);
        pdVar18 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data + lVar59;
        bVar19 = (bool)((byte)uVar55 & 1);
        bVar20 = (bool)((byte)(uVar55 >> 1) & 1);
        bVar21 = (bool)((byte)(uVar55 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar55 >> 3) & 1);
        bVar23 = (bool)((byte)(uVar55 >> 4) & 1);
        bVar24 = (bool)((byte)(uVar55 >> 5) & 1);
        bVar25 = (bool)((byte)(uVar55 >> 6) & 1);
        *pdVar18 = (double)((ulong)bVar19 * auVar71._0_8_ | (ulong)!bVar19 * (long)*pdVar18);
        pdVar18[1] = (double)((ulong)bVar20 * auVar71._8_8_ | (ulong)!bVar20 * (long)pdVar18[1]);
        pdVar18[2] = (double)((ulong)bVar21 * auVar71._16_8_ | (ulong)!bVar21 * (long)pdVar18[2]);
        pdVar18[3] = (double)((ulong)bVar22 * auVar71._24_8_ | (ulong)!bVar22 * (long)pdVar18[3]);
        pdVar18[4] = (double)((ulong)bVar23 * auVar71._32_8_ | (ulong)!bVar23 * (long)pdVar18[4]);
        pdVar18[5] = (double)((ulong)bVar24 * auVar71._40_8_ | (ulong)!bVar24 * (long)pdVar18[5]);
        pdVar18[6] = (double)((ulong)bVar25 * auVar71._48_8_ | (ulong)!bVar25 * (long)pdVar18[6]);
        pdVar18[7] = (double)((uVar55 >> 7) * auVar71._56_8_ |
                             (ulong)!SUB81(uVar55 >> 7,0) * (long)pdVar18[7]);
        lVar59 = lVar59 + 8;
      } while (((vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
    }
    ppCVar69 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    lVar59 = (long)(sysd->vconstraints).
                   super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar69;
    if (lVar59 != 0) {
      uVar54 = 1;
      uVar55 = 0;
      iVar62 = 0;
      do {
        pCVar14 = ppCVar69[uVar55];
        if (pCVar14->active == true) {
          if (pCVar14->mode == CONSTRAINT_LOCK) {
            if ((iVar62 < 0) ||
               (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                <= iVar62)) goto LAB_007c3a57;
            vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [iVar62] = this->rho_b;
          }
          iVar62 = iVar62 + 1;
        }
        uVar55 = (ulong)uVar54;
        uVar54 = uVar54 + 1;
      } while (uVar55 < (ulong)(lVar59 >> 3));
    }
    lVar59 = std::chrono::_V2::system_clock::now();
    Eigen::SparseMatrix<double,_1,_int>::resize
              (&((this->LS_solver).
                 super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_mat,lVar68,lVar68);
    ChSparsityPatternLearner::ChSparsityPatternLearner(&sparsity_pattern,iVar67,iVar67);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&sparsity_pattern,0);
    ChSparsityPatternLearner::Apply(&sparsity_pattern,&local_1e8);
    (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&local_1e8,&B);
    if (this->precond == true) {
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&IS,lVar68);
      if ((int)nrows < 0) goto LAB_007c3b58;
      local_328 = (Scalar *)0x0;
      local_320 = (StorageIndex *)0x1;
      local_330 = (SparseMatrix<double,_1,_int> *)&IS;
      local_318 = pCVar64;
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
          (long)pCVar64) {
        pcVar58 = 
        "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>]"
        ;
LAB_007c37e3:
        local_320 = (StorageIndex *)0x1;
        local_328 = (Scalar *)0x0;
        __assert_fail("m_xpr.rows() >= other.rows() && m_xpr.cols() >= other.cols() && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x2f,pcVar58);
      }
      local_230 = (DstXprType *)local_310;
      local_248._0_8_ = &dstEvaluator;
      local_248._8_8_ = &srcEvaluator;
      srcEvaluator.m_functor.m_other = 1.0;
      local_310 = (undefined1  [8])
                  IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_data = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_238 = &local_409;
      local_300.m_value = 1;
      vStack_2f0.m_value = 0;
      vStack_2e8.m_value = 0;
      CStack_2e0.m_values =
           (Scalar *)
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_outerStride.m_value =
           IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_308.m_value = (long)pCVar64;
      pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&IS;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_248);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_330,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&S);
      if (((long)&(local_318->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + (long)local_328 !=
           *(long *)&local_330->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>) ||
         (local_320 != (StorageIndex *)0x1)) {
LAB_007c37f2:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          local_1e8.m_outerSize) {
        pcVar58 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::SparseMatrix<double, 1>, Option = 0]"
        ;
LAB_007c38f7:
        __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                      ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar58);
      }
      local_310 = (undefined1  [8])((ulong)local_310 & 0xffffffffffffff00);
      local_308.m_value = local_308.m_value & 0xffffffffffffff00;
      local_300.m_value = (long)&IS;
      pSStack_2f8 = &local_1e8;
      vStack_2f0.m_value = (long)&IS;
      if (local_1e8.m_innerSize !=
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::SparseMatrix<double, 1>>, _Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 0]"
        ;
        goto LAB_007c38f7;
      }
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)&local_1e8,
                 (SparseMatrixBase<Eigen::Product<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_1,_int>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                  *)local_310);
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::Matrix<double, -1, 1>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::Matrix<double, -1, 1>, Option = 1]"
        ;
        goto LAB_007c38f7;
      }
      uVar55 = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
               7;
      if (-1 < IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar55 = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar68 = 0;
        do {
          auVar71 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (B.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar68),
                                   *(undefined1 (*) [64])
                                    (IS.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar68));
          *(undefined1 (*) [64])
           (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar68) = auVar71;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar55);
      }
      if ((long)uVar55 <
          IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar55]
               = IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar55] *
                 B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar55];
          uVar55 = uVar55 + 1;
        } while (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar55);
      }
      if (IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
    }
    peVar15 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (local_1e8.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
        super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue == true) {
      IVar61 = (peVar15->m_mat).m_outerSize;
      IVar57 = (peVar15->m_mat).m_innerSize;
      (peVar15->m_mat).m_outerSize = local_1e8.m_outerSize;
      (peVar15->m_mat).m_innerSize = local_1e8.m_innerSize;
      pSVar33 = (peVar15->m_mat).m_outerIndex;
      pSVar34 = (peVar15->m_mat).m_innerNonZeros;
      pSVar35 = (peVar15->m_mat).m_data.m_values;
      pSVar32 = (peVar15->m_mat).m_data.m_indices;
      (peVar15->m_mat).m_outerIndex = local_1e8.m_outerIndex;
      (peVar15->m_mat).m_innerNonZeros = local_1e8.m_innerNonZeros;
      (peVar15->m_mat).m_data.m_values = local_1e8.m_data.m_values;
      (peVar15->m_mat).m_data.m_indices = local_1e8.m_data.m_indices;
      IVar28 = (peVar15->m_mat).m_data.m_size;
      IVar29 = (peVar15->m_mat).m_data.m_allocatedSize;
      (peVar15->m_mat).m_data.m_size = local_1e8.m_data.m_size;
      (peVar15->m_mat).m_data.m_allocatedSize = local_1e8.m_data.m_allocatedSize;
      local_1e8.m_outerSize = IVar61;
      local_1e8.m_innerSize = IVar57;
      local_1e8.m_outerIndex = pSVar33;
      local_1e8.m_innerNonZeros = pSVar34;
      local_1e8.m_data.m_values = pSVar35;
      local_1e8.m_data.m_indices = pSVar32;
      local_1e8.m_data.m_size = IVar28;
      local_1e8.m_data.m_allocatedSize = IVar29;
    }
    else {
      pCVar6 = &peVar15->m_mat;
      if (pCVar6 != &local_1e8) {
        Eigen::SparseMatrix<double,1,int>::initAssignment<Eigen::SparseMatrix<double,1,int>>
                  ((SparseMatrix<double,1,int> *)pCVar6,&local_1e8);
        if (local_1e8.m_innerNonZeros == (StorageIndex *)0x0) {
          sVar7 = (peVar15->m_mat).m_outerSize * 4 + 4;
          if (sVar7 != 0) {
            memcpy((peVar15->m_mat).m_outerIndex,local_1e8.m_outerIndex,sVar7);
          }
          Eigen::internal::CompressedStorage<double,_int>::operator=
                    (&(peVar15->m_mat).m_data,&local_1e8.m_data);
        }
        else {
          Eigen::internal::
          assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseMatrix<double,1,int>>
                    (pCVar6,&local_1e8);
        }
      }
    }
    IVar61 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    pdVar18 = B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    peVar15 = (this->LS_solver).
              super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (((peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
        ) && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&(peVar15->m_rhs).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                         m_rows,1),
             (peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows != IVar61)) {
LAB_007c3933:
      pcVar58 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007c39a6:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar58);
    }
    pdVar16 = (peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    uVar55 = IVar61 + 7;
    if (-1 < IVar61) {
      uVar55 = IVar61;
    }
    uVar55 = uVar55 & 0xfffffffffffffff8;
    if (7 < IVar61) {
      lVar68 = 0;
      do {
        pdVar1 = pdVar18 + lVar68;
        dVar91 = pdVar1[1];
        dVar8 = pdVar1[2];
        dVar9 = pdVar1[3];
        dVar36 = pdVar1[4];
        dVar37 = pdVar1[5];
        dVar38 = pdVar1[6];
        dVar39 = pdVar1[7];
        pdVar2 = pdVar16 + lVar68;
        *pdVar2 = *pdVar1;
        pdVar2[1] = dVar91;
        pdVar2[2] = dVar8;
        pdVar2[3] = dVar9;
        pdVar2[4] = dVar36;
        pdVar2[5] = dVar37;
        pdVar2[6] = dVar38;
        pdVar2[7] = dVar39;
        lVar68 = lVar68 + 8;
      } while (lVar68 < (long)uVar55);
    }
    if ((long)uVar55 < IVar61) {
      do {
        pdVar16[uVar55] = pdVar18[uVar55];
        uVar55 = uVar55 + 1;
      } while (IVar61 != uVar55);
    }
    if (0 < (int)uVar49) {
      uVar55 = 0;
      do {
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar55) {
LAB_007c3a57:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar91 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[uVar55];
        dVar8 = this->sigma;
        lVar68 = (long)&(pCVar64->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + uVar55;
        pSVar51 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                            (&((this->LS_solver).
                               super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_mat,lVar68,lVar68);
        uVar55 = uVar55 + 1;
        *pSVar51 = *pSVar51 - (dVar91 + dVar8);
      } while (uVar65 != uVar55);
    }
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar52 = GetLog();
      pCVar53 = ChStreamOutAscii::operator<<
                          (&pCVar52->super_ChStreamOutAscii," Time for ConvertToMatrixForm: << ");
      lVar68 = std::chrono::_V2::system_clock::now();
      pCVar53 = ChStreamOutAscii::operator<<(pCVar53,(double)(lVar68 - lVar59) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar53,"s\n");
    }
    lVar68 = std::chrono::_V2::system_clock::now();
    (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
    std::chrono::_V2::system_clock::now();
    if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
      pCVar52 = GetLog();
      pCVar53 = ChStreamOutAscii::operator<<
                          (&pCVar52->super_ChStreamOutAscii," Time for factorize : << ");
      lVar59 = std::chrono::_V2::system_clock::now();
      pCVar53 = ChStreamOutAscii::operator<<(pCVar53,(double)(lVar59 - lVar68) / 1000000000.0);
      ChStreamOutAscii::operator<<(pCVar53,"s\n");
    }
    if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
      uVar54 = 0;
      local_188 = (long)&(pCVar64->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data + rows;
      local_180 = (long)(int)(nrows | uVar49);
      alignedEnd = rows & 0xfffffffffffffff8;
      alignedEnd_1 = (Index)(nrows & 0x7ffffff8);
LAB_007c2038:
      IVar61 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar18 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if ((l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1),
         l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         IVar61)) goto LAB_007c3933;
      IVar57 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar16 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar55 = IVar61 + 7;
      if (-1 < IVar61) {
        uVar55 = IVar61;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < IVar61) {
        lVar68 = 0;
        do {
          pdVar1 = pdVar18 + lVar68;
          dVar91 = pdVar1[1];
          dVar8 = pdVar1[2];
          dVar9 = pdVar1[3];
          dVar36 = pdVar1[4];
          dVar37 = pdVar1[5];
          dVar38 = pdVar1[6];
          dVar39 = pdVar1[7];
          pdVar2 = l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data + lVar68;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar91;
          pdVar2[2] = dVar8;
          pdVar2[3] = dVar9;
          pdVar2[4] = dVar36;
          pdVar2[5] = dVar37;
          pdVar2[6] = dVar38;
          pdVar2[7] = dVar39;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar55);
      }
      if ((long)uVar55 < IVar61) {
        do {
          l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar55] = pdVar18[uVar55];
          uVar55 = uVar55 + 1;
        } while (IVar61 != uVar55);
      }
      if ((z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1),
         z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         IVar57)) goto LAB_007c3933;
      IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar18 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar55 = IVar57 + 7;
      if (-1 < IVar57) {
        uVar55 = IVar57;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < IVar57) {
        lVar68 = 0;
        do {
          pdVar1 = pdVar16 + lVar68;
          dVar91 = pdVar1[1];
          dVar8 = pdVar1[2];
          dVar9 = pdVar1[3];
          dVar36 = pdVar1[4];
          dVar37 = pdVar1[5];
          dVar38 = pdVar1[6];
          dVar39 = pdVar1[7];
          pdVar2 = z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data + lVar68;
          *pdVar2 = *pdVar1;
          pdVar2[1] = dVar91;
          pdVar2[2] = dVar8;
          pdVar2[3] = dVar9;
          pdVar2[4] = dVar36;
          pdVar2[5] = dVar37;
          pdVar2[6] = dVar38;
          pdVar2[7] = dVar39;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar55);
      }
      if ((long)uVar55 < IVar57) {
        do {
          z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar55] = pdVar16[uVar55];
          uVar55 = uVar55 + 1;
        } while (IVar57 != uVar55);
      }
      if ((y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1),
         y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         IVar61)) goto LAB_007c3933;
      uVar55 = IVar61 + 7;
      if (-1 < IVar61) {
        uVar55 = IVar61;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < IVar61) {
        lVar68 = 0;
        do {
          pdVar16 = pdVar18 + lVar68;
          dVar91 = pdVar16[1];
          dVar8 = pdVar16[2];
          dVar9 = pdVar16[3];
          dVar36 = pdVar16[4];
          dVar37 = pdVar16[5];
          dVar38 = pdVar16[6];
          dVar39 = pdVar16[7];
          pdVar1 = y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data + lVar68;
          *pdVar1 = *pdVar16;
          pdVar1[1] = dVar91;
          pdVar1[2] = dVar8;
          pdVar1[3] = dVar9;
          pdVar1[4] = dVar36;
          pdVar1[5] = dVar37;
          pdVar1[6] = dVar38;
          pdVar1[7] = dVar39;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar55);
      }
      if ((long)uVar55 < IVar61) {
        do {
          y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar55] = pdVar18[uVar55];
          uVar55 = uVar55 + 1;
        } while (IVar61 != uVar55);
      }
      if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007c39e0;
      }
      if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007c39e0;
      }
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007c39e0;
      }
      if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007c39e0;
      }
      srcEvaluator.m_functor.m_other = 0.0;
      srcEvaluator._8_8_ = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                 vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows,1);
      pdVar3 = vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar2 = b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar1 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar16 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      pdVar18 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if ((srcEvaluator._8_8_ !=
           y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1), srcEvaluator._8_8_ != IVar61)) {
        pcVar58 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
        ;
        goto LAB_007c39a6;
      }
      uVar55 = IVar61 + 7;
      if (-1 < IVar61) {
        uVar55 = IVar61;
      }
      if (7 < IVar61) {
        lVar68 = 0;
        do {
          auVar71 = vsubpd_avx512f(ZEXT864(0) << 0x40,*(undefined1 (*) [64])(pdVar2 + lVar68));
          auVar72 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar68),
                                   *(undefined1 (*) [64])(pdVar16 + lVar68));
          auVar72 = vmulpd_avx512f(auVar72,*(undefined1 (*) [64])(pdVar18 + lVar68));
          auVar71 = vaddpd_avx512f(auVar71,auVar72);
          auVar71 = vsubpd_avx512f(auVar71,*(undefined1 (*) [64])(pdVar1 + lVar68));
          *(undefined1 (*) [64])((long)srcEvaluator.m_functor.m_other + lVar68 * 8) = auVar71;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)(uVar55 & 0xfffffffffffffff8));
      }
      if ((long)(uVar55 & 0xfffffffffffffff8) < IVar61) {
        lVar68 = (long)uVar55 >> 3;
        lVar59 = 0;
        do {
          *(double *)((long)srcEvaluator.m_functor.m_other + lVar68 * 0x40 + lVar59 * 8) =
               ((pdVar3[lVar68 * 8 + lVar59] + pdVar16[lVar68 * 8 + lVar59]) *
                pdVar18[lVar68 * 8 + lVar59] - pdVar2[lVar68 * 8 + lVar59]) -
               pdVar1[lVar68 * 8 + lVar59];
          lVar59 = lVar59 + 1;
        } while (IVar61 % 8 != lVar59);
      }
      peVar15 = (this->LS_solver).
                super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_330 = (SparseMatrix<double,_1,_int> *)&peVar15->m_rhs;
      local_328 = (Scalar *)0x0;
      local_320 = (StorageIndex *)0x1;
      local_318 = (ChVectorDynamic<> *)
                  k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pCVar17 = (ChVectorDynamic<> *)
                (peVar15->m_rhs).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
      if ((long)pCVar17 <
          k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const DenseBase<OtherDerived> &) [MatrixType = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_007c37e3;
      }
      local_310 = (undefined1  [8])
                  (((ChVectorDynamic<double> *)local_330)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      local_308.m_value =
           k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      local_300.m_value = 1;
      if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0 &&
          local_310 != (undefined1  [8])0x0) {
LAB_007c38c0:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      vStack_2f0.m_value = 0;
      vStack_2e8.m_value = 0;
      pSStack_2f8 = local_330;
      CStack_2e0.m_values = (Scalar *)pCVar17;
      if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 0) {
LAB_007c3846:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_248._0_8_ = &dstEvaluator;
      local_248._8_8_ = &IS;
      local_238 = &local_409;
      IS.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_230 = (DstXprType *)local_310;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_data = (PointerType)local_310;
      dstEvaluator.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,_1>_>
      .m_outerStride.m_value = (long)pCVar17;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)local_248);
      Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_330,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&srcEvaluator);
      if (((long)&(local_318->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data + (long)local_328 !=
           *(long *)&local_330->super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>) ||
         (local_320 != (StorageIndex *)0x1)) goto LAB_007c37f2;
      lVar68 = std::chrono::_V2::system_clock::now();
      (*(((this->LS_solver).super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super_ChSolverLS).super_ChSolver._vptr_ChSolver[0xb])();
      std::chrono::_V2::system_clock::now();
      if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
        pCVar52 = GetLog();
        pCVar53 = ChStreamOutAscii::operator<<
                            (&pCVar52->super_ChStreamOutAscii," Time for solve : << ");
        lVar59 = std::chrono::_V2::system_clock::now();
        pCVar53 = ChStreamOutAscii::operator<<(pCVar53,(double)(lVar59 - lVar68) / 1000000000.0);
        ChStreamOutAscii::operator<<(pCVar53,"s\n");
      }
      peVar15 = (this->LS_solver).
                super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pdVar18 = (peVar15->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      if (pdVar18 != (double *)0x0 && (int)uVar49 < 0) goto LAB_007c38c0;
      if ((local_180 < 0) ||
         ((peVar15->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows < local_188)) goto LAB_007c3846;
      if ((l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != rows
          ) && (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,rows,1)
               , l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != rows)) {
        pcVar58 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
        ;
        goto LAB_007c39a6;
      }
      if (0 < alignedEnd) {
        lVar68 = 0;
        do {
          auVar71 = vsubpd_avx512f(ZEXT1664((undefined1  [16])0x0),
                                   *(undefined1 (*) [64])
                                    (pdVar18 +
                                    (long)&(pCVar64->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                           ).m_storage.m_data + lVar68));
          *(undefined1 (*) [64])
           (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar68) = auVar71;
          lVar68 = lVar68 + 8;
        } while (lVar68 < alignedEnd);
      }
      IVar61 = alignedEnd;
      if (alignedEnd != rows) {
        do {
          auVar78._0_8_ =
               -pdVar18[(long)&(pCVar64->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data + IVar61];
          auVar78._8_8_ = 0x8000000000000000;
          dVar91 = (double)vmovlpd_avx(auVar78);
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[IVar61]
               = dVar91;
          IVar61 = IVar61 + 1;
        } while (IVar61 < (long)rows);
      }
      peVar15 = (this->LS_solver).
                super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pdVar18 = (peVar15->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      if (pdVar18 != (double *)0x0 && (int)nrows < 0) goto LAB_007c38c0;
      if (((int)nrows < 0) ||
         ((peVar15->m_sol).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows < (long)pCVar64)) goto LAB_007c3846;
      if (((ChVectorDynamic<> *)
           v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           pCVar64) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     (Index)pCVar64,1),
         (ChVectorDynamic<> *)
         v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
         pCVar64)) {
        pcVar58 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Block<Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
        ;
        goto LAB_007c39a6;
      }
      IVar61 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      pdVar2 = y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar1 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar16 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      if (alignedEnd_1 != 0) {
        uVar55 = 0;
        do {
          pdVar3 = pdVar18 + uVar55;
          dVar91 = pdVar3[1];
          dVar8 = pdVar3[2];
          dVar9 = pdVar3[3];
          dVar36 = pdVar3[4];
          dVar37 = pdVar3[5];
          dVar38 = pdVar3[6];
          dVar39 = pdVar3[7];
          pdVar4 = v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                   + uVar55;
          *pdVar4 = *pdVar3;
          pdVar4[1] = dVar91;
          pdVar4[2] = dVar8;
          pdVar4[3] = dVar9;
          pdVar4[4] = dVar36;
          pdVar4[5] = dVar37;
          pdVar4[6] = dVar38;
          pdVar4[7] = dVar39;
          uVar55 = uVar55 + 8;
        } while (uVar55 < (ulong)alignedEnd_1);
      }
      IVar57 = alignedEnd_1;
      if ((ChVectorDynamic<> *)alignedEnd_1 != pCVar64) {
        do {
          v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[IVar57]
               = pdVar18[IVar57];
          IVar57 = IVar57 + 1;
        } while (IVar57 < (long)pCVar64);
      }
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      goto LAB_007c388c;
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
          y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        pcVar58 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
        ;
        goto LAB_007c39e0;
      }
      if ((z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
           y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
         (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                     y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows,1),
         z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != IVar61
         )) {
        pcVar58 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
        ;
        goto LAB_007c39a6;
      }
      uVar55 = IVar61 + 7;
      if (-1 < IVar61) {
        uVar55 = IVar61;
      }
      uVar55 = uVar55 & 0xfffffffffffffff8;
      if (7 < IVar61) {
        lVar68 = 0;
        do {
          auVar71 = vdivpd_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar68),
                                   *(undefined1 (*) [64])(pdVar1 + lVar68));
          auVar71 = vaddpd_avx512f(auVar71,*(undefined1 (*) [64])(pdVar16 + lVar68));
          *(undefined1 (*) [64])
           (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar68) = auVar71;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar55);
      }
      if ((long)uVar55 < IVar61) {
        do {
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar55]
               = pdVar2[uVar55] / pdVar1[uVar55] + pdVar16[uVar55];
          uVar55 = uVar55 + 1;
        } while (IVar61 != uVar55);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x18])(sysd,&z);
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [_Lhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, _Rhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Option = 1]"
          ;
          goto LAB_007c38f7;
        }
        if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Product<Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, 1>]"
          ;
          goto LAB_007c39e0;
        }
        uVar55 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
                 7;
        if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        {
          uVar55 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          ;
        }
        uVar55 = uVar55 & 0xfffffffffffffff8;
        if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          lVar68 = 0;
          do {
            auVar71 = vsubpd_avx512f(*(undefined1 (*) [64])
                                      (l.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar68),
                                     *(undefined1 (*) [64])
                                      (z.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                       .m_storage.m_data + lVar68));
            auVar71 = vmulpd_avx512f(auVar71,*(undefined1 (*) [64])
                                              (vrho.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar68));
            auVar71 = vaddpd_avx512f(auVar71,*(undefined1 (*) [64])
                                              (y.
                                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                               .m_storage.m_data + lVar68));
            *(undefined1 (*) [64])
             (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             lVar68) = auVar71;
            lVar68 = lVar68 + 8;
          } while (lVar68 < (long)uVar55);
        }
        if ((long)uVar55 <
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          do {
            y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [uVar55] = (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data[uVar55] -
                       z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar55]) *
                       vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_data[uVar55] +
                       y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar55];
            uVar55 = uVar55 + 1;
          } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                   != uVar55);
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c39cb;
        }
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
        goto LAB_007c39b2;
        if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows != 0)
        {
          local_300.m_value = (long)&z;
          pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&l;
          vStack_2e8.m_value = (long)&S;
          if (0 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            local_230 = (DstXprType *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_228.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_220.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            SVar75 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_248,(scalar_max_op<double,_double,_0> *)&local_330,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_310);
            this->r_prim = SVar75;
            if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
            goto LAB_007c39cb;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) goto LAB_007c2953;
            local_308.m_value = (long)&z;
            local_300.m_value = (long)&l;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar58 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              goto LAB_007c3adc;
            }
            local_238 = (assign_op<double,_double> *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_230 = (DstXprType *)
                        l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_3d0 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_248,(scalar_max_op<double,_double,_0> *)&local_330,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)local_310);
            IVar61 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
            goto LAB_007c295f;
          }
LAB_007c3a1e:
          local_300.m_value = (long)&z;
          pcVar58 = 
          "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
          ;
          goto LAB_007c3adc;
        }
        this->r_prim = 0.0;
LAB_007c2953:
        IVar61 = 0;
        local_3d0 = 0.0;
LAB_007c295f:
        if (IVar61 != z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows) goto LAB_007c39cb;
        if (IVar61 != vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) goto LAB_007c39b2;
        if (IVar61 != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows) {
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c39e0;
        }
        if (IVar61 != 0) {
          pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&z;
          vStack_2f0.m_value = (long)&z_old;
          CStack_2e0.m_values = (Scalar *)&vrho;
          CStack_2e0.m_size = (Index)&S;
          if (IVar61 < 1) {
            pcVar58 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
            ;
            goto LAB_007c3adc;
          }
          local_228.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)
               z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_220.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)
               z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          ;
          local_218.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
          local_210.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          SVar76 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_248,(scalar_max_op<double,_double,_0> *)&local_330,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_310);
          this->r_dual = SVar76;
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c39cb;
          if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              == vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
            if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows == 0) {
              local_3d8 = 0.0;
            }
            else {
              local_300.m_value = (long)&z;
              pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&z_old;
              vStack_2e8.m_value = (long)&vrho;
              if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows < 1) goto LAB_007c3a1e;
              local_230 = (DstXprType *)
                          z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_228.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
              local_220.m_d.data =
                   (plainobjectbase_evaluator_data<double,_0>)
                   (plainobjectbase_evaluator_data<double,_0>)
                   vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data;
              local_3d8 = Eigen::internal::
                          redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                          ::
                          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                      *)local_248,(scalar_max_op<double,_double,_0> *)&local_330,
                                     (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      *)local_310);
            }
            goto LAB_007c2ae9;
          }
LAB_007c39b2:
          pcVar58 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c39e0;
        }
        local_3d8 = 0.0;
        this->r_dual = 0.0;
        if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
            0) goto LAB_007c39b2;
LAB_007c2ae9:
        if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
          pCVar52 = GetLog();
          pCVar53 = ChStreamOutAscii::operator<<(&pCVar52->super_ChStreamOutAscii,"ADMM iter=");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,uVar54);
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53," prim=");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,this->r_prim);
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53," dual=");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,this->r_dual);
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,"  rho=");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,local_1f8);
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,"  tols=");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,this->tol_prim);
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53," ");
          pCVar53 = ChStreamOutAscii::operator<<(pCVar53,this->tol_dual);
          ChStreamOutAscii::operator<<(pCVar53,"\n");
        }
        if ((this->super_ChIterativeSolverVI).record_violation_history != true) {
LAB_007c2dd9:
          if ((this->r_prim < this->tol_prim) && (this->r_dual < this->tol_dual)) {
            if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true) {
              pCVar52 = GetLog();
              pCVar53 = ChStreamOutAscii::operator<<
                                  (&pCVar52->super_ChStreamOutAscii,"ADMM converged ok! at iter=");
              pCVar53 = ChStreamOutAscii::operator<<(pCVar53,uVar54);
              ChStreamOutAscii::operator<<(pCVar53,"\n");
            }
            if (srcEvaluator.m_functor.m_other != 0.0) {
              free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
            }
            goto LAB_007c3338;
          }
          if ((int)uVar54 % this->stepadjust_each == 0) {
            auVar80 = ZEXT816(0x3ff0000000000000);
            AVar50 = this->stepadjust_type;
            if (AVar50 == BALANCED_UNSCALED) {
              auVar82._0_8_ = local_3d0 / local_3d8;
              auVar82._8_8_ = 0;
              if (auVar82._0_8_ < 0.0) {
                auVar74._0_8_ = sqrt(auVar82._0_8_);
                auVar74._8_56_ = extraout_var_01;
                auVar80 = auVar74._0_16_;
              }
              else {
                auVar80 = vsqrtsd_avx(auVar82,auVar82);
              }
              AVar50 = this->stepadjust_type;
            }
            if (AVar50 == BALANCED_FAST) {
              auVar83 = ZEXT816(0) << 0x40;
              auVar84 = ZEXT816(0) << 0x40;
              if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != 0) {
                local_248._0_8_ = &z;
                if (0 < z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
                  local_308.m_value =
                       (long)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data;
                  auVar87._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)local_310,(scalar_max_op<double,_double,_0> *)&local_330,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                   *)local_248);
                  auVar87._8_56_ = extraout_var_02;
                  auVar84 = auVar87._0_16_;
                  auVar83 = ZEXT816(0);
                  goto LAB_007c2eac;
                }
LAB_007c3ac7:
                pcVar58 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
                ;
LAB_007c3adc:
                __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                              ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar58);
              }
LAB_007c2eac:
              auVar92._0_8_ = auVar84._0_8_;
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != 0) {
                local_248._0_8_ = &l;
                if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007c3ac7;
                local_308.m_value =
                     (long)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                auVar88._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_310,(scalar_max_op<double,_double,_0> *)&local_330,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                 *)local_248);
                auVar88._8_56_ = extraout_var_03;
                auVar83 = auVar88._0_16_;
                auVar92._8_8_ = 0;
                auVar84 = auVar92;
              }
              dVar91 = 1e-10;
              if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  != 0) {
                local_248._0_8_ = &y;
                if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) goto LAB_007c3ac7;
                local_308.m_value =
                     (long)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data;
                SVar77 = Eigen::internal::
                         redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)local_310,(scalar_max_op<double,_double,_0> *)&local_330,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                     *)local_248);
                auVar84._8_8_ = 0;
                auVar84._0_8_ = auVar92._0_8_;
                dVar91 = SVar77 + 1e-10;
                auVar83._8_8_ = 0;
              }
              auVar80 = vmaxsd_avx(auVar84,auVar83);
              auVar85._0_8_ = (local_3d0 / (auVar80._0_8_ + 1e-10)) / (local_3d8 / dVar91 + 1e-10);
              auVar85._8_8_ = 0;
              if (auVar85._0_8_ < 0.0) {
                auVar89._0_8_ = sqrt(auVar85._0_8_);
                auVar89._8_56_ = extraout_var_04;
                auVar80 = auVar89._0_16_;
              }
              else {
                auVar80 = vsqrtsd_avx(auVar85,auVar85);
              }
              AVar50 = this->stepadjust_type;
            }
            if (AVar50 == BALANCED_RANGE) {
              auVar10._0_8_ = this->r_prim;
              auVar10._8_8_ = this->r_dual;
              auVar11._0_8_ = this->tol_prim;
              auVar11._8_8_ = this->tol_dual;
              auVar80 = vdivpd_avx(auVar10,auVar11);
              auVar12 = vshufpd_avx(auVar80,auVar80,1);
              auVar86._0_8_ = auVar80._0_8_ / (auVar12._0_8_ + 1e-10);
              auVar86._8_8_ = auVar80._8_8_;
              if (auVar86._0_8_ < 0.0) {
                auVar90._0_8_ = sqrt(auVar86._0_8_);
                auVar90._8_56_ = extraout_var_05;
                auVar80 = auVar90._0_16_;
              }
              else {
                auVar80 = vsqrtsd_avx(auVar86,auVar86);
              }
            }
            auVar93._8_8_ = 0;
            auVar93._0_8_ = this->stepadjust_maxfactor;
            auVar94._0_8_ = 1.0 / this->stepadjust_maxfactor;
            auVar94._8_8_ = 0;
            auVar80 = vmaxsd_avx(auVar94,auVar80);
            auVar80 = vminsd_avx(auVar93,auVar80);
            dVar91 = auVar80._0_8_;
            if ((this->stepadjust_threshold < dVar91) || (dVar91 < 1.0 / this->stepadjust_threshold)
               ) {
              lVar68 = std::chrono::_V2::system_clock::now();
              if (0 < (int)uVar49) {
                uVar55 = 0;
                do {
                  if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows <= (long)uVar55) goto LAB_007c3a57;
                  dVar8 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[uVar55];
                  dVar9 = this->sigma;
                  lVar59 = nrows + uVar55;
                  pSVar51 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                      (&((this->LS_solver).
                                         super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_mat,lVar59,lVar59);
                  uVar55 = uVar55 + 1;
                  *pSVar51 = dVar8 + dVar9 + *pSVar51;
                } while (uVar65 != uVar55);
              }
              if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows < 0) goto LAB_007c3b58;
              auVar71 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              local_1f8 = local_1f8 * dVar91;
              if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows != 0) {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = local_1f8;
                auVar72 = vbroadcastsd_avx512f(auVar13);
                auVar73 = vpbroadcastq_avx512f();
                lVar59 = 0;
                do {
                  auVar74 = vpbroadcastq_avx512f();
                  auVar74 = vporq_avx512f(auVar74,auVar71);
                  uVar55 = vpcmpuq_avx512f(auVar74,auVar73,2);
                  pdVar18 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_data + lVar59;
                  bVar19 = (bool)((byte)uVar55 & 1);
                  bVar20 = (bool)((byte)(uVar55 >> 1) & 1);
                  bVar21 = (bool)((byte)(uVar55 >> 2) & 1);
                  bVar22 = (bool)((byte)(uVar55 >> 3) & 1);
                  bVar23 = (bool)((byte)(uVar55 >> 4) & 1);
                  bVar24 = (bool)((byte)(uVar55 >> 5) & 1);
                  bVar25 = (bool)((byte)(uVar55 >> 6) & 1);
                  *pdVar18 = (double)((ulong)bVar19 * auVar72._0_8_ |
                                     (ulong)!bVar19 * (long)*pdVar18);
                  pdVar18[1] = (double)((ulong)bVar20 * auVar72._8_8_ |
                                       (ulong)!bVar20 * (long)pdVar18[1]);
                  pdVar18[2] = (double)((ulong)bVar21 * auVar72._16_8_ |
                                       (ulong)!bVar21 * (long)pdVar18[2]);
                  pdVar18[3] = (double)((ulong)bVar22 * auVar72._24_8_ |
                                       (ulong)!bVar22 * (long)pdVar18[3]);
                  pdVar18[4] = (double)((ulong)bVar23 * auVar72._32_8_ |
                                       (ulong)!bVar23 * (long)pdVar18[4]);
                  pdVar18[5] = (double)((ulong)bVar24 * auVar72._40_8_ |
                                       (ulong)!bVar24 * (long)pdVar18[5]);
                  pdVar18[6] = (double)((ulong)bVar25 * auVar72._48_8_ |
                                       (ulong)!bVar25 * (long)pdVar18[6]);
                  pdVar18[7] = (double)((uVar55 >> 7) * auVar72._56_8_ |
                                       (ulong)!SUB81(uVar55 >> 7,0) * (long)pdVar18[7]);
                  lVar59 = lVar59 + 8;
                } while (((vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
                         (ulong)((uint)(vrho.
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_rows + 0x1fffffffffffffffU) & 7) != lVar59);
              }
              ppCVar69 = (sysd->vconstraints).
                         super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              lVar59 = (long)(sysd->vconstraints).
                             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar69;
              if (lVar59 != 0) {
                uVar63 = 1;
                uVar55 = 0;
                iVar67 = 0;
                do {
                  pCVar14 = ppCVar69[uVar55];
                  if (pCVar14->active == true) {
                    if (pCVar14->mode == CONSTRAINT_LOCK) {
                      if ((iVar67 < 0) ||
                         (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows <= iVar67)) goto LAB_007c3a57;
                      vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[iVar67] = this->rho_b;
                    }
                    iVar67 = iVar67 + 1;
                  }
                  uVar55 = (ulong)uVar63;
                  uVar63 = uVar63 + 1;
                } while (uVar55 < (ulong)(lVar59 >> 3));
              }
              if (0 < (int)uVar49) {
                uVar55 = 0;
                do {
                  if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows <= (long)uVar55) goto LAB_007c3a57;
                  dVar91 = vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[uVar55];
                  dVar8 = this->sigma;
                  lVar59 = nrows + uVar55;
                  pSVar51 = Eigen::SparseMatrix<double,_1,_int>::coeffRef
                                      (&((this->LS_solver).
                                         super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_mat,lVar59,lVar59);
                  uVar55 = uVar55 + 1;
                  *pSVar51 = *pSVar51 - (dVar91 + dVar8);
                } while (uVar65 != uVar55);
              }
              (*(((this->LS_solver).
                  super___shared_ptr<chrono::ChDirectSolverLS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChSolverLS).super_ChSolver._vptr_ChSolver[10])();
              std::chrono::_V2::system_clock::now();
              if ((this->super_ChIterativeSolverVI).super_ChSolverVI.super_ChSolver.verbose == true)
              {
                pCVar52 = GetLog();
                pCVar53 = ChStreamOutAscii::operator<<
                                    (&pCVar52->super_ChStreamOutAscii," Time for re-factorize : << "
                                    );
                lVar59 = std::chrono::_V2::system_clock::now();
                pCVar53 = ChStreamOutAscii::operator<<
                                    (pCVar53,(double)(lVar59 - lVar68) / 1000000000.0);
                ChStreamOutAscii::operator<<(pCVar53,"s\n");
              }
            }
          }
          if (srcEvaluator.m_functor.m_other != 0.0) {
            free(*(void **)((long)srcEvaluator.m_functor.m_other + -8));
          }
          uVar54 = uVar54 + 1;
          if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations <=
              (int)uVar54) goto LAB_007c3338;
          goto LAB_007c2038;
        }
        if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
            l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
              S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          goto LAB_007c39b2;
          local_300.m_value = (long)&z;
          pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&l;
          vStack_2e8.m_value = (long)&S;
          if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows == 0
             ) {
            IVar61 = 0;
            local_288 = 0.0;
          }
          else {
            if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <
                1) {
              pcVar58 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_007c3adc;
            }
            local_230 = (DstXprType *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_228.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_220.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            local_288 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_248,(scalar_sum_op<double,_double> *)&local_330,
                                   (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)local_310);
            IVar61 = z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows;
          }
          if (IVar61 != z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows) goto LAB_007c39cb;
          if (IVar61 != S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
            pcVar58 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_quotient_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_007c39e0;
          }
          local_300.m_value = (long)&z;
          pSStack_2f8 = (SparseMatrix<double,_1,_int> *)&z_old;
          vStack_2e8.m_value = (long)&S;
          if (IVar61 == 0) {
            auVar79 = ZEXT816(0) << 0x40;
          }
          else {
            if (IVar61 < 1) {
              pcVar58 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
              ;
              goto LAB_007c3adc;
            }
            local_230 = (DstXprType *)
                        z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_data;
            local_228.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
            local_220.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
            auVar72._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                             *)local_248,(scalar_sum_op<double,_double> *)&local_330,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             *)local_310);
            auVar72._8_56_ = extraout_var;
            auVar79 = auVar72._0_16_;
          }
          if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
              l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
          {
            local_308.m_value = (long)&l;
            local_300.m_value = (long)&l_old;
            if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
                0) {
              auVar80 = SUB6416(ZEXT864(0),0) << 0x40;
            }
            else {
              if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  < 1) {
                pcVar58 = 
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                ;
                goto LAB_007c3adc;
              }
              local_238 = (assign_op<double,_double> *)
                          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data;
              local_230 = (DstXprType *)
                          l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data;
              auVar73._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_248,(scalar_sum_op<double,_double> *)&local_330,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_310);
              auVar73._8_56_ = extraout_var_00;
              auVar80 = auVar73._0_16_;
              auVar79._8_8_ = 0;
            }
            auVar12 = vsqrtsd_avx(auVar80,auVar80);
            auVar81._8_8_ = 0;
            auVar81._0_8_ = local_288;
            auVar80 = vsqrtpd_avx(auVar81);
            auVar78 = vsqrtsd_avx(auVar79,auVar79);
            ChIterativeSolverVI::AtIterationEnd
                      (&this->super_ChIterativeSolverVI,auVar80._0_8_ + auVar78._0_8_,auVar12._0_8_,
                       uVar54);
            goto LAB_007c2dd9;
          }
        }
      }
LAB_007c39cb:
      pcVar58 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_007c39e0;
    }
LAB_007c3338:
    if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      uVar65 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + 7
      ;
      if (-1 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        uVar65 = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      }
      uVar65 = uVar65 & 0xfffffffffffffff8;
      if (7 < l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        lVar68 = 0;
        do {
          auVar71 = vmulpd_avx512f(*(undefined1 (*) [64])
                                    (l.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar68),
                                   *(undefined1 (*) [64])
                                    (S.
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                     m_storage.m_data + lVar68));
          *(undefined1 (*) [64])
           (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           lVar68) = auVar71;
          lVar68 = lVar68 + 8;
        } while (lVar68 < (long)uVar65);
      }
      if ((long)uVar65 <
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        do {
          l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar65]
               = l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar65] *
                 S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                 [uVar65];
          uVar65 = uVar65 + 1;
        } while (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                 != uVar65);
      }
      (*sysd->_vptr_ChSystemDescriptor[0x13])(sysd,&l);
      (*sysd->_vptr_ChSystemDescriptor[0x11])(sysd,&v);
      local_440 = this->r_dual;
      ChSparsityPatternLearner::~ChSparsityPatternLearner(&sparsity_pattern);
      if (vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)vrho.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)vsigma.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_data[-1]);
      }
      if (S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)S.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)y_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)z_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)l_old.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)y.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)z.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)l.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)B.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      local_1e8._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(local_1e8.m_outerIndex);
      free(local_1e8.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_1e8.m_data);
      if (b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)b.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      if (k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)k.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      E._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(E.m_outerIndex);
      free(E.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&E.m_data);
      Cq._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b0c488;
      free(Cq.m_outerIndex);
      free(Cq.m_innerNonZeros);
      Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&Cq.m_data);
LAB_007c3729:
      if (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data[-1]);
      }
      return local_440;
    }
  }
LAB_007c3b77:
  pcVar58 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
LAB_007c39e0:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar58);
}

Assistant:

double ChSolverADMM::_SolveBasic(ChSystemDescriptor& sysd) {

    ChTimer<> m_timer_convert;
    ChTimer<> m_timer_factorize;
    ChTimer<> m_timer_solve;

    double rho_i = this->rho;

    std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();

    int nc = sysd.CountActiveConstraints();
    int nv = sysd.CountActiveVariables();

    ChVectorDynamic<> v(nv);

    // shortcut for the case of no constraints:
    if (nc == 0) {

        ChSparseMatrix H(nv, nv);
        ChVectorDynamic<> k(nv);


        m_timer_convert.start();

        // sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        //sysd.ConvertToMatrixForm(0, &LS_solver->A(), 0, &LS_solver->b(), 0, 0, 0);
        // much faster to fill brand new sparse matrices??!!

        ChSparsityPatternLearner sparsity_pattern(nv, nv);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0);
        sysd.ConvertToMatrixForm(&sparsity_pattern, 0); 
        sparsity_pattern.Apply(H);
        sysd.ConvertToMatrixForm(&H,&k);  
        LS_solver->A() = H; 
        LS_solver->b() = k; 

        m_timer_convert.stop();
        if (this->verbose) GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

        // v = H\k
        LS_solver->SetupCurrent();
        LS_solver->SolveCurrent();

        //v = LS_solver->x();
        sysd.FromVectorToVariables(LS_solver->x());

        return 0;
    }
        
    ChSparseMatrix Cq(nc,nv);
    ChSparseMatrix E(nc,nc);
    ChVectorDynamic<> k(nv);
    ChVectorDynamic<> b(nc);

    ChSparseMatrix    A(nv+nc,nv+nc);
    ChVectorDynamic<> B(nv+nc);
    //ChVectorDynamic<> X(nv+nc);


    ChVectorDynamic<> l(nc);
    ChVectorDynamic<> z(nc);
    ChVectorDynamic<> y(nc);

    ChVectorDynamic<> l_old(nc);
    ChVectorDynamic<> z_old(nc);
    ChVectorDynamic<> y_old(nc);
    
    sysd.ConvertToMatrixForm(&Cq, 0, &E, &k, &b, 0);
    Cq.makeCompressed();
    E.makeCompressed();

    if (!this->m_warm_start) {
        l.setZero();
        z.setZero();
        y.setZero();
    }
    else
    {
        // warmstarted l:
        sysd.FromConstraintsToVector(l, false);

        // warmstarted v:
        //v = H\(k + D*l); // PERFORMANCE HIT, probably better reuse last v if possible..
        sysd.FromVariablesToVector(v, false); // this works supposing that variables have been warmstarted with "v" too, otherwise:  

        // warmstarted y:
        // the following correct only if r_dual was approx.=0. //***TODO*** as parameter
        y = - (Cq*v - E*l + b); //  dual residual exploiting the kkt form instead of - (N*l+r), faster!
            
        /*
        GetLog() << "Y warmastarted:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
        */
        
        // warmstarted z:
        z = l; //  warm start also this - should project? //***TODO*** as parameter
        //sysd.ConstraintsProject(z);

        // y_hat  = y;   // only for spectral stepsize
    }

    ChVectorDynamic<> S(nc);

    if (this->precond == true) {
        // Compute diagonal values of N , only mass effect, neglecting stiffness for the moment, TODO
        //  g_i=[Cq_i]*[invM_i]*[Cq_i]' 
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Update_auxiliary();

        // Average all g_i for the triplet of contact constraints n,u,v.
        int j_friction_comp = 0;
        double gi_values[3];
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
            if (mconstraints[ic]->GetMode() == CONSTRAINT_FRIC) {
                gi_values[j_friction_comp] = mconstraints[ic]->Get_g_i();
                j_friction_comp++;
                if (j_friction_comp == 3) {
                    double average_g_i = (gi_values[0] + gi_values[1] + gi_values[2]) / 3.0;
                    mconstraints[ic - 2]->Set_g_i(average_g_i);
                    mconstraints[ic - 1]->Set_g_i(average_g_i);
                    mconstraints[ic - 0]->Set_g_i(average_g_i);
                    j_friction_comp = 0;
                }
            }
        }
        // The vector with the diagonal of the N matrix
        S.setZero();
        int d_i = 0;
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive()) {
                S(d_i, 0) = sqrt(mconstraints[ic]->Get_g_i());  // square root of diagonal of N, just mass matrices considered, no stiffness matrices anyway
                ++d_i;
            }
        // Now we should scale Cq, E, b as
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        
        // but to avoid storing Cq and E and assembly in A, we postpone this by scaling the entire A matrix later via a IS*A*IS operation
        
        // b = diag(S)*b;
        b = b.cwiseProduct(S);

        // warm started values must be scaled too
        l = l.cwiseQuotient(S); // from l to \breve{l}
        z = z.cwiseQuotient(S); 
        y = y.cwiseProduct(S);

    }
    else {
        S.setConstant(1);
    }  

    // vsigma = ones(nconstr,1)*sigma;
    ChVectorDynamic<> vsigma(nc); // not needed
    vsigma.setConstant(this->sigma);
    

    // vrho = ones(nconstr,1)*rho;
    ChVectorDynamic<> vrho(nc);
    vrho.setConstant(rho_i);

    // vrho(fric==-2) = rho_b;          // special step for bilateral joints
    int s_c = 0;
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive()) {
            if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                vrho(s_c) = rho_b;
            s_c++;
        }
    }
 
    // FACTORIZATION
    //
    // A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    
    m_timer_convert.start();

    LS_solver->A().resize(nv + nc, nv + nc); // otherwise conservativeResize in ConvertToMatrixForm() causes error

    //sysd.ConvertToMatrixForm(&LS_solver->A(),&LS_solver->b());  // A = [M, Cq'; Cq, E ];
    // much faster to fill brand new sparse matrices??!!
    ChSparsityPatternLearner sparsity_pattern(nv + nc, nv + nc);
    sysd.ConvertToMatrixForm(&sparsity_pattern, nullptr);
    sparsity_pattern.Apply(A);

    sysd.ConvertToMatrixForm(&A,&B);  // A = [M, Cq'; Cq, E ]; 

    if (this->precond) {
        // the following is equivalent to having scaled 
        // Cq = Cq*diag(S);
        // E = diag(S)*E*diag(S);
        ChVectorDynamic<> IS(nv + nc);
        IS << Eigen::VectorXd::Ones(nv) , S;
        A = IS.asDiagonal() * A * IS.asDiagonal();
        B = IS.asDiagonal() * B; // not needed? B here only factorization...
    }

    LS_solver->A() = A; 
    LS_solver->b() = B; 

    for (int i = 0; i < nc; ++i)
        LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));  //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];

    m_timer_convert.stop();
    if (this->verbose)
        GetLog() << " Time for ConvertToMatrixForm: << " << m_timer_convert.GetTimeSecondsIntermediate() << "s\n";

    m_timer_factorize.start();

    LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

    m_timer_factorize.stop();
    if (this->verbose)
        GetLog() << " Time for factorize : << " << m_timer_factorize.GetTimeSecondsIntermediate() << "s\n";

    /*
    res_story.r_prim=zeros(1,1);
    res_story.r_dual_Nlry=zeros(1,1);
    res_story.r_dual=zeros(1,1);
    res_story.r_combined_pre=zeros(1,1);
    res_story.r_combined=zeros(1,1);
    res_story.r_deltal=zeros(1,1);
    res_story.r_rho=zeros(1,1);
    res_story.r_violation=zeros(1,1);
    */

    for (int iter = 0; iter < m_max_iterations; iter++) {
        // diagnostic
        l_old = l;
        z_old = z;
        y_old = y;

        // X   (lambda)

        // SOLVE LINEAR SYSTEM HERE
        // ckkt = -bkkt + (vsigma+vrho).*z - y;

        ChVectorDynamic<> ckkt = -b + (vsigma + vrho).cwiseProduct(z) - y;
        LS_solver->b() << k, ckkt;  // B = [k;ckkt];

        m_timer_solve.start();

        LS_solver->SolveCurrent();                                                      // LU forward/backsolve ++++++++++++++++++++++++++++++++++++++
        
        m_timer_solve.stop();
        if (this->verbose) GetLog() << " Time for solve : << " << m_timer_solve.GetTimeSecondsIntermediate() << "s\n";

        // x = dA\B;      // A* x = B  with x = [v, -l]    
        l = -LS_solver->x().block(nv, 0, nc, 1);
        v =  LS_solver->x().block(0, 0, nv, 1);
        

        // Z

        //    z = project_orthogonal(l + y. / vrho, fric); 
        z = l + y.cwiseQuotient(vrho);
        sysd.ConstraintsProject(z); 

        // Y

        y = y + vrho.asDiagonal() * (l - z);


        // y_hat = y + vrho .* (l - z_old);   


        // Compute residuals for tolerances


        r_prim = ((z - l).cwiseProduct(S)).lpNorm<Eigen::Infinity>();     //r_prim     = norm((z - l).*S, inf);   
        double r_prim_pre = (z - l).lpNorm<Eigen::Infinity>();              //r_prim_pre = norm((z - l)   , inf); 

        r_dual = (((z - z_old).cwiseProduct(vrho)).cwiseQuotient(S)).lpNorm<Eigen::Infinity>(); // r_dual = norm((vrho.*(z - z_old)). / S, inf); % even faster!See book of Boyd.But coincides only for alpha = 1 !!!
        double r_dual_pre = ((z - z_old).cwiseProduct(vrho)).lpNorm<Eigen::Infinity>();  // r_dual_pre     = norm((vrho.*(z - z_old))   ,inf); 

        //r_combined = norm((z - l).*S, 2) + norm((z - z_old). / S, 2);% combined res.in original metric
        //r_combined_pre = norm((z - l), 2) + norm((z - z_old), 2);% combined res.in precond.metric

        /*
        res_story.r_prim(j) = r_prim;
        res_story.r_dual_Nlry(j) = r_dual_Nlry;
        res_story.r_dual(j) = r_dual;
        res_story.r_combined_pre(j) = r_combined_pre;
        res_story.r_combined(j) = r_combined;
        res_story.r_rho(j) = rho_i;
        res_story.r_deltal(j) = norm((l - l_old).*S, inf);% diagnostic
        */

        if (this->verbose)
            GetLog() << "ADMM iter=" << iter << " prim=" << r_prim << " dual=" << r_dual << "  rho=" << rho_i << "  tols=" << this->tol_prim << " " << this->tol_dual <<  "\n";

        // For recording into violation history, if debugging
        if (this->record_violation_history) {
            // combined residual 
            double r_combined = ((z - l).cwiseProduct(S)).norm() + ((z - z_old).cwiseQuotient(S)).norm();
            AtIterationEnd(r_combined, (l - l_old).norm(), iter);
        }

        // Termination:
        if ((r_prim < this->tol_prim) && (r_dual < this->tol_dual)) {
            if (this->verbose)
                GetLog() << "ADMM converged ok! at iter=" << iter << "\n";
            break;
        }



        // once in a while update the rho step parameter
        if ((iter % this->stepadjust_each) == 0) {

            double rhofactor = 1; // default do not shrink / enlarge

            if (this->stepadjust_type == AdmmStepType::NONE) {
                rhofactor = 1.;
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_UNSCALED) {
                rhofactor = sqrt(r_prim_pre / r_dual_pre);
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_FAST) {
                double r_prim_scaled = r_prim_pre / (ChMax(z.lpNorm<Eigen::Infinity>(), l.lpNorm<Eigen::Infinity>()) + 1e-10); // maybe norm(l, inf) very similar to norm(z, inf)
                double r_dual_scaled = r_dual_pre / (y.lpNorm<Eigen::Infinity>() + 1e-10);  //  as in "ADMM Penalty Parameter Selection by Residual Balancing", Brendt Wohlberg
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }

            if (this->stepadjust_type == AdmmStepType::BALANCED_RANGE) {
                double r_prim_scaled = r_prim / this->tol_prim;
                double r_dual_scaled = r_dual / this->tol_dual;
                rhofactor = sqrt(r_prim_scaled / (r_dual_scaled + 1e-10));
            }


            // safeguards against extreme shrinking
            if (rhofactor < 1.0 / this->stepadjust_maxfactor) {
                rhofactor = 1.0 / this->stepadjust_maxfactor;
            }
            if (rhofactor > this->stepadjust_maxfactor) {
                rhofactor = this->stepadjust_maxfactor;
            }

            if ((rhofactor > this->stepadjust_threshold) || (rhofactor < 1.0 / this->stepadjust_threshold)) {

                ChTimer<> m_timer_refactorize;
                m_timer_refactorize.start();

                // Avoid rebuilding all sparse matrix: 
                // A) just remove old rho with -= :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) -= -(sigma + vrho(i));

                // Update rho
                rho_i = rho_i * rhofactor;

                // vrho(fric == -2) = rho_b; //  special step for bilateral joints
                vrho.setConstant(rho_i);
                s_c = 0;
                for (unsigned int ic = 0; ic < mconstraints.size(); ic++) {
                    if (mconstraints[ic]->IsActive()) {
                        if (mconstraints[ic]->GetMode()==eChConstraintMode::CONSTRAINT_LOCK)
                            vrho(s_c) = rho_b;
                        s_c++;
                    }
                }

                // UPDATE FACTORIZATION
                //
                //  A = [M, Cq'; Cq, -diag(vsigma+vrho) + E ];
                //
                // To avoid rebuilding A, we just removed the rho step from the diagonal in A), and now: 
                // B) add old rho with += :
                for (int i = 0; i < nc; ++i)
                    LS_solver->A().coeffRef(nv + i, nv + i) += -(sigma + vrho(i));

                LS_solver->SetupCurrent();  // LU decomposition ++++++++++++++++++++++++++++++++++++++

                m_timer_refactorize.stop();
                if (this->verbose) GetLog() << " Time for re-factorize : << " << m_timer_refactorize.GetTimeSecondsIntermediate() << "s\n";
            }

        } // end step adjust


    } // end iteration

    l = l.cwiseProduct(S);

    /*
    GetLog() << "Y resulting:  \n";
        for (int k = 0; k < ChMin(y.rows(), 10); ++k)
            GetLog() << "  " << y(k) << "\n";
    */

    sysd.FromVectorToConstraints(l);
    sysd.FromVectorToVariables(v);

    return r_dual;
}